

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

field_t * SEM_DefList(ast *node,int ins)

{
  int iVar1;
  field_t *pfVar2;
  ast *paVar3;
  int in_ESI;
  ast *in_RDI;
  field_t *q;
  field_t *p;
  field_t *f;
  field_t *local_30;
  undefined8 in_stack_ffffffffffffffd8;
  field_t *pfVar4;
  ast *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  field_t *local_8;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (in_RDI->type == -1) {
    local_8 = (field_t *)0x0;
  }
  else {
    child(in_RDI,1);
    local_30 = SEM_Def(in_stack_ffffffffffffffe0,iVar1);
    for (pfVar4 = local_30; pfVar4->next != (field_t *)0x0; pfVar4 = pfVar4->next) {
    }
    child(in_RDI,2);
    pfVar2 = SEM_DefList((ast *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                         (int)((ulong)local_30 >> 0x20));
    pfVar4->next = pfVar2;
    pfVar4 = pfVar4->next;
    local_8 = local_30;
    if (in_ESI == 0) {
      for (; pfVar2 = local_30, local_8 = local_30, pfVar4 != (field_t *)0x0; pfVar4 = pfVar4->next)
      {
        for (; local_30 != pfVar4; local_30 = local_30->next) {
          iVar1 = strcmp(pfVar4->name,local_30->name);
          if (iVar1 == 0) {
            paVar3 = child(in_RDI,2);
            semerror(0xf,(int)(ulong)(uint)paVar3->pos->first_line,semErrorMsg[0xf],pfVar4->name);
          }
        }
        local_30 = pfVar2;
      }
    }
  }
  return local_8;
}

Assistant:

static struct field_t* SEM_DefList(struct ast *node, int ins) {
    if (node->type == NullNode)
        return NULL;
    struct field_t *f = SEM_Def(child(node, 1), ins), *p = f, *q;
    while (p->next) {
        p = p->next;
    }
    p->next = SEM_DefList(child(node, 2), ins);
    p = p->next;
    if (!ins) {
        while (p) {
            q = f;
            while (q != p) {
                if (strcmp(p->name, q->name) == 0) {
                    SEMERROR(RedefinedField, child(node, 2), p->name);
                }
                q = q->next;
            }
            p = p->next;
        }
    }
    return f;
}